

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O3

QSize __thiscall QScrollArea::viewportSizeHint(QScrollArea *this)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  QFontMetrics local_20 [8];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  lVar2 = *(long *)(lVar1 + 0x2f8);
  if (((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) ||
     (plVar3 = *(long **)(lVar1 + 0x300), plVar3 == (long *)0x0)) {
    QFontMetrics::QFontMetrics
              (local_20,&((this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->fnt);
    iVar4 = QFontMetrics::height();
    QFontMetrics::~QFontMetrics(local_20);
    uVar5 = (ulong)(uint)(iVar4 * 6);
    uVar6 = (ulong)(uint)(iVar4 << 2);
  }
  else {
    if (*(char *)(lVar1 + 0x310) == '\x01') {
      uVar5 = (**(code **)(*plVar3 + 0x70))(plVar3,in_RSI,*(undefined4 *)(lVar2 + 4));
    }
    else {
      lVar1 = plVar3[4];
      uVar5 = CONCAT44((*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18)) + 1,
                       (*(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14)) + 1);
    }
    uVar6 = uVar5 >> 0x20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QSize)(uVar5 & 0xffffffff | uVar6 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QScrollArea::viewportSizeHint() const
{
    Q_D(const QScrollArea);
    if (d->widget) {
        return d->resizable ? d->widget->sizeHint() : d->widget->size();
    }
    const int h = fontMetrics().height();
    return QSize(6 * h, 4 * h);
}